

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_register_iolib(HSQUIRRELVM v)

{
  undefined8 uVar1;
  SQInteger top;
  HSQUIRRELVM v_local;
  
  uVar1 = sq_gettop(v);
  declare_stream(v,"file",&DAT_80000001,"std_file",_file_methods,iolib_funcs);
  sq_pushstring(v,"stdout",0xffffffffffffffff);
  sqstd_createfile(v,_stdout,0);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_pushstring(v,"stdin",0xffffffffffffffff);
  sqstd_createfile(v,_stdin,0);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_pushstring(v,"stderr",0xffffffffffffffff);
  sqstd_createfile(v,_stderr,0);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_settop(v,uVar1);
  return 0;
}

Assistant:

SQRESULT sqstd_register_iolib(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    //create delegate
    declare_stream(v,_SC("file"),(SQUserPointer)SQSTD_FILE_TYPE_TAG,_SC("std_file"),_file_methods,iolib_funcs);
    sq_pushstring(v,_SC("stdout"),-1);
    sqstd_createfile(v,stdout,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("stdin"),-1);
    sqstd_createfile(v,stdin,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("stderr"),-1);
    sqstd_createfile(v,stderr,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_settop(v,top);
    return SQ_OK;
}